

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O0

int has_top_right(AV1_COMMON *cm,MACROBLOCKD *xd,int mi_row,int mi_col,int bs)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool local_35;
  int has_tr;
  int mask_col;
  int mask_row;
  int sb_mi_size;
  int bs_local;
  int mi_col_local;
  int mi_row_local;
  MACROBLOCKD *xd_local;
  AV1_COMMON *cm_local;
  int local_4;
  
  uVar1 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                [cm->seq_params->sb_size];
  uVar2 = mi_row & uVar1 - 1;
  uVar3 = mi_col & uVar1 - 1;
  if (bs < 0x11) {
    local_35 = (uVar2 & bs) != 0 && (uVar3 & bs) != 0;
    has_tr = (int)((local_35 ^ 0xffU) & 1);
    bs_local = bs;
    while( true ) {
      if (((int)uVar1 <= bs_local) || ((uVar3 & bs_local) == 0)) goto LAB_006d7d5d;
      if (((uVar3 & bs_local << 1) != 0) && ((uVar2 & bs_local << 1) != 0)) break;
      bs_local = bs_local << 1;
    }
    has_tr = 0;
LAB_006d7d5d:
    if ((xd->width < xd->height) && ((xd->is_last_vertical_rect & 1U) == 0)) {
      has_tr = 1;
    }
    if ((xd->height < xd->width) && ((xd->is_first_horizontal_rect & 1U) == 0)) {
      has_tr = 0;
    }
    if ((((*xd->mi)->partition == '\x06') && (xd->width == xd->height)) && ((uVar2 & bs_local) != 0)
       ) {
      has_tr = 0;
    }
    local_4 = has_tr;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int has_top_right(const AV1_COMMON *cm, const MACROBLOCKD *xd,
                         int mi_row, int mi_col, int bs) {
  const int sb_mi_size = mi_size_wide[cm->seq_params->sb_size];
  const int mask_row = mi_row & (sb_mi_size - 1);
  const int mask_col = mi_col & (sb_mi_size - 1);

  if (bs > mi_size_wide[BLOCK_64X64]) return 0;

  // In a split partition all apart from the bottom right has a top right
  int has_tr = !((mask_row & bs) && (mask_col & bs));

  // bs > 0 and bs is a power of 2
  assert(bs > 0 && !(bs & (bs - 1)));

  // For each 4x4 group of blocks, when the bottom right is decoded the blocks
  // to the right have not been decoded therefore the bottom right does
  // not have a top right
  while (bs < sb_mi_size) {
    if (mask_col & bs) {
      if ((mask_col & (2 * bs)) && (mask_row & (2 * bs))) {
        has_tr = 0;
        break;
      }
    } else {
      break;
    }
    bs <<= 1;
  }

  // In a VERTICAL or VERTICAL_4 partition, all partition before the last one
  // always have a top right (as the block above will have been decoded).
  if (xd->width < xd->height) {
    if (!xd->is_last_vertical_rect) has_tr = 1;
  }

  // In a HORIZONTAL or HORIZONTAL_4 partition, partitions after the first one
  // never have a top right (as the block to the right won't have been decoded).
  if (xd->width > xd->height) {
    if (!xd->is_first_horizontal_rect) has_tr = 0;
  }

  // The bottom left square of a Vertical A (in the old format) does
  // not have a top right as it is decoded before the right hand
  // rectangle of the partition
  if (xd->mi[0]->partition == PARTITION_VERT_A) {
    if (xd->width == xd->height)
      if (mask_row & bs) has_tr = 0;
  }

  return has_tr;
}